

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O0

void dfsfast_preorder(Abc_Ntk_t *pNtk)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar7;
  int *__s;
  Abc_Obj_t *pAVar8;
  int local_4c;
  int qpos;
  int end;
  int d;
  int j;
  int i;
  Vec_Int_t *qe;
  Vec_Ptr_t *qn;
  Vec_Ptr_t *vTimeIn;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar4 = Abc_NtkObjNum(pNtk);
  p = Vec_PtrAlloc(iVar4);
  iVar4 = Abc_NtkObjNum(pNtk);
  p_00 = Vec_IntAlloc(iVar4);
  local_4c = 0;
  if (pManMR->maxDelay != 0) {
    for (d = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), d < iVar4; d = d + 1) {
      pAVar7 = Abc_NtkObj(pNtk,d);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        end = 0;
        while( true ) {
          pVVar2 = pManMR->vTimeEdges;
          uVar5 = Abc_ObjId(pAVar7);
          iVar4 = Vec_PtrSize(pVVar2 + uVar5);
          if (iVar4 <= end) break;
          pVVar2 = pManMR->vTimeEdges;
          uVar5 = Abc_ObjId(pAVar7);
          pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2 + uVar5,end);
          pFVar1 = pManMR->pDataArray;
          uVar5 = Abc_ObjId(pAVar8);
          qn = pFVar1[uVar5].field_1.vNodes;
          if (qn == (Vec_Ptr_t *)0x0) {
            qn = Vec_PtrAlloc(2);
            pFVar1 = pManMR->pDataArray;
            uVar5 = Abc_ObjId(pAVar8);
            pFVar1[uVar5].field_1.vNodes = qn;
          }
          Vec_PtrPush(qn,pAVar7);
          end = end + 1;
        }
      }
    }
  }
  if (pManMR->vSinkDistHist != (Vec_Int_t *)0x0) {
    __s = Vec_IntArray(pManMR->vSinkDistHist);
    iVar4 = Vec_IntSize(pManMR->vSinkDistHist);
    memset(__s,0,(long)iVar4 << 2);
    for (d = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), d < iVar4; d = d + 1) {
      pAVar7 = Abc_NtkObj(pNtk,d);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        iVar4 = Abc_ObjIsPo(pAVar7);
        if (((iVar4 == 0) && (iVar4 = Abc_ObjIsLatch(pAVar7), iVar4 == 0)) &&
           ((pManMR->fIsForward == 0 ||
            (pFVar1 = pManMR->pDataArray, uVar5 = Abc_ObjId(pAVar7),
            (*(ushort *)(pFVar1 + uVar5) & 0x90 & pManMR->constraintMask) == 0)))) {
          iVar4 = Abc_ObjIsPi(pAVar7);
          if ((iVar4 != 0) ||
             ((pManMR->fIsForward == 0 &&
              (pFVar1 = pManMR->pDataArray, uVar5 = Abc_ObjId(pAVar7),
              (*(ushort *)(pFVar1 + uVar5) & 0x90 & pManMR->constraintMask) != 0)))) {
            Vec_PtrPush(p,pAVar7);
            Vec_IntPush(p_00,0x65);
            pFVar1 = pManMR->pDataArray;
            uVar5 = Abc_ObjId(pAVar7);
            *(uint *)&pFVar1[uVar5].field_0x10 = *(uint *)&pFVar1[uVar5].field_0x10 & 0xffff0000 | 1
            ;
          }
        }
        else {
          Vec_PtrPush(p,pAVar7);
          Vec_IntPush(p_00,0x72);
          pFVar1 = pManMR->pDataArray;
          uVar5 = Abc_ObjId(pAVar7);
          *(uint *)&pFVar1[uVar5].field_0x10 = *(uint *)&pFVar1[uVar5].field_0x10 & 0xffff | 0x10000
          ;
        }
      }
    }
    while( true ) {
      iVar4 = Vec_PtrSize(p);
      if (iVar4 <= local_4c) {
        if (pManMR->maxDelay != 0) {
          for (d = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), d < iVar4; d = d + 1) {
            pAVar7 = Abc_NtkObj(pNtk,d);
            if (pAVar7 != (Abc_Obj_t *)0x0) {
              pFVar1 = pManMR->pDataArray;
              uVar5 = Abc_ObjId(pAVar7);
              pVVar2 = pFVar1[uVar5].field_1.vNodes;
              if (pVVar2 != (Vec_Ptr_t *)0x0) {
                Vec_PtrFree(pVVar2);
                pFVar1 = pManMR->pDataArray;
                uVar5 = Abc_ObjId(pAVar7);
                pFVar1[uVar5].field_1.pred = (Abc_Obj_t *)0x0;
              }
            }
          }
        }
        for (d = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), d < iVar4; d = d + 1) {
          pAVar7 = Abc_NtkObj(pNtk,d);
          if (pAVar7 != (Abc_Obj_t *)0x0) {
            pVVar3 = pManMR->vSinkDistHist;
            pFVar1 = pManMR->pDataArray;
            uVar5 = Abc_ObjId(pAVar7);
            Vec_IntAddToEntry(pVVar3,*(uint *)&pFVar1[uVar5].field_0x10 >> 0x10,1);
            pVVar3 = pManMR->vSinkDistHist;
            pFVar1 = pManMR->pDataArray;
            uVar5 = Abc_ObjId(pAVar7);
            Vec_IntAddToEntry(pVVar3,*(uint *)&pFVar1[uVar5].field_0x10 & 0xffff,1);
          }
        }
        Vec_PtrFree(p);
        Vec_IntFree(p_00);
        return;
      }
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,local_4c);
      if (pAVar7 == (Abc_Obj_t *)0x0) break;
      iVar4 = Vec_IntEntry(p_00,local_4c);
      local_4c = local_4c + 1;
      if (iVar4 == 0x72) {
        pFVar1 = pManMR->pDataArray;
        uVar5 = Abc_ObjId(pAVar7);
        uVar5 = *(uint *)&pFVar1[uVar5].field_0x10 >> 0x10;
        if (pManMR->fIsForward == 0) {
          for (d = 0; iVar4 = Abc_ObjFanoutNum(pAVar7), d < iVar4; d = d + 1) {
            pAVar8 = Abc_ObjFanout(pAVar7,d);
            pFVar1 = pManMR->pDataArray;
            uVar6 = Abc_ObjId(pAVar8);
            if ((*(uint *)&pFVar1[uVar6].field_0x10 & 0xffff) == 0) {
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar8);
              *(uint *)&pFVar1[uVar6].field_0x10 =
                   *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff0000 | uVar5 + 1 & 0xffff;
              Vec_PtrPush(p,pAVar8);
              Vec_IntPush(p_00,0x65);
            }
          }
        }
        else {
          for (d = 0; iVar4 = Abc_ObjFaninNum(pAVar7), d < iVar4; d = d + 1) {
            pAVar8 = Abc_ObjFanin(pAVar7,d);
            pFVar1 = pManMR->pDataArray;
            uVar6 = Abc_ObjId(pAVar8);
            if ((*(uint *)&pFVar1[uVar6].field_0x10 & 0xffff) == 0) {
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar8);
              *(uint *)&pFVar1[uVar6].field_0x10 =
                   *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff0000 | uVar5 + 1 & 0xffff;
              Vec_PtrPush(p,pAVar8);
              Vec_IntPush(p_00,0x65);
            }
          }
        }
        if ((uVar5 != 1) && (pManMR->fIsForward != 0)) {
          for (d = 0; iVar4 = Abc_ObjFanoutNum(pAVar7), d < iVar4; d = d + 1) {
            pAVar8 = Abc_ObjFanout(pAVar7,d);
            pFVar1 = pManMR->pDataArray;
            uVar6 = Abc_ObjId(pAVar8);
            if ((*(uint *)&pFVar1[uVar6].field_0x10 >> 0x10 == 0) &&
               (iVar4 = Abc_ObjIsLatch(pAVar8), iVar4 == 0)) {
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar8);
              *(uint *)&pFVar1[uVar6].field_0x10 =
                   *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff | (uVar5 + 1) * 0x10000;
              Vec_PtrPush(p,pAVar8);
              Vec_IntPush(p_00,0x72);
            }
          }
          if ((pManMR->maxDelay != 0) &&
             (pFVar1 = pManMR->pDataArray, uVar6 = Abc_ObjId(pAVar7),
             pFVar1[uVar6].field_1.pred != (Abc_Obj_t *)0x0)) {
            d = 0;
            while( true ) {
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar7);
              iVar4 = Vec_PtrSize(pFVar1[uVar6].field_1.vNodes);
              if (iVar4 <= d) break;
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar7);
              pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pFVar1[uVar6].field_1.vNodes,d);
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar8);
              if (*(uint *)&pFVar1[uVar6].field_0x10 >> 0x10 == 0) {
                pFVar1 = pManMR->pDataArray;
                uVar6 = Abc_ObjId(pAVar8);
                *(uint *)&pFVar1[uVar6].field_0x10 =
                     *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff | (uVar5 + 1) * 0x10000;
                Vec_PtrPush(p,pAVar8);
                Vec_IntPush(p_00,0x72);
              }
              d = d + 1;
            }
          }
        }
      }
      else {
        iVar4 = Abc_ObjIsLatch(pAVar7);
        if (iVar4 == 0) {
          pFVar1 = pManMR->pDataArray;
          uVar5 = Abc_ObjId(pAVar7);
          uVar5 = *(uint *)&pFVar1[uVar5].field_0x10 & 0xffff;
          pFVar1 = pManMR->pDataArray;
          uVar6 = Abc_ObjId(pAVar7);
          if (*(uint *)&pFVar1[uVar6].field_0x10 >> 0x10 == 0) {
            pFVar1 = pManMR->pDataArray;
            uVar6 = Abc_ObjId(pAVar7);
            *(uint *)&pFVar1[uVar6].field_0x10 =
                 *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff | (uVar5 + 1) * 0x10000;
            Vec_PtrPush(p,pAVar7);
            Vec_IntPush(p_00,0x72);
          }
          if (pManMR->fIsForward == 0) {
            for (d = 0; iVar4 = Abc_ObjFaninNum(pAVar7), d < iVar4; d = d + 1) {
              pAVar8 = Abc_ObjFanin(pAVar7,d);
              pFVar1 = pManMR->pDataArray;
              uVar6 = Abc_ObjId(pAVar8);
              if (((*(uint *)&pFVar1[uVar6].field_0x10 & 0xffff) == 0) &&
                 (iVar4 = Abc_ObjIsLatch(pAVar8), iVar4 == 0)) {
                pFVar1 = pManMR->pDataArray;
                uVar6 = Abc_ObjId(pAVar8);
                *(uint *)&pFVar1[uVar6].field_0x10 =
                     *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff0000 | uVar5 + 1 & 0xffff;
                Vec_PtrPush(p,pAVar8);
                Vec_IntPush(p_00,0x65);
              }
            }
            if ((pManMR->maxDelay != 0) &&
               (pFVar1 = pManMR->pDataArray, uVar6 = Abc_ObjId(pAVar7),
               pFVar1[uVar6].field_1.pred != (Abc_Obj_t *)0x0)) {
              d = 0;
              while( true ) {
                pFVar1 = pManMR->pDataArray;
                uVar6 = Abc_ObjId(pAVar7);
                iVar4 = Vec_PtrSize(pFVar1[uVar6].field_1.vNodes);
                if (iVar4 <= d) break;
                pFVar1 = pManMR->pDataArray;
                uVar6 = Abc_ObjId(pAVar7);
                pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pFVar1[uVar6].field_1.vNodes,d);
                pFVar1 = pManMR->pDataArray;
                uVar6 = Abc_ObjId(pAVar8);
                if ((*(uint *)&pFVar1[uVar6].field_0x10 & 0xffff) == 0) {
                  pFVar1 = pManMR->pDataArray;
                  uVar6 = Abc_ObjId(pAVar8);
                  *(uint *)&pFVar1[uVar6].field_0x10 =
                       *(uint *)&pFVar1[uVar6].field_0x10 & 0xffff0000 | uVar5 + 1 & 0xffff;
                  Vec_PtrPush(p,pAVar8);
                  Vec_IntPush(p_00,0x65);
                }
                d = d + 1;
              }
            }
          }
        }
      }
    }
    __assert_fail("pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                  ,0x62,"void dfsfast_preorder(Abc_Ntk_t *)");
  }
  __assert_fail("pManMR->vSinkDistHist",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                ,0x4d,"void dfsfast_preorder(Abc_Ntk_t *)");
}

Assistant:

void dfsfast_preorder( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj, *pNext;
  Vec_Ptr_t *vTimeIn, *qn = Vec_PtrAlloc(Abc_NtkObjNum(pNtk));
  Vec_Int_t *qe = Vec_IntAlloc(Abc_NtkObjNum(pNtk));
  int i, j, d = 0, end;
  int qpos = 0;

  // create reverse timing edges for backward traversal
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      Vec_PtrForEachEntry( Abc_Obj_t *, FTIMEEDGES(pObj), pNext, j ) {
        vTimeIn = FDATA(pNext)->vNodes;
        if (!vTimeIn) {
          vTimeIn = FDATA(pNext)->vNodes = Vec_PtrAlloc(2);
        }
        Vec_PtrPush(vTimeIn, pObj);
      }
    }
  }
#endif

  // clear histogram
  assert(pManMR->vSinkDistHist);
  memset(Vec_IntArray(pManMR->vSinkDistHist), 0, sizeof(int)*Vec_IntSize(pManMR->vSinkDistHist));

  // seed queue : latches, PIOs, and blocks
  Abc_NtkForEachObj( pNtk, pObj, i )
    if (Abc_ObjIsPo(pObj) ||
        Abc_ObjIsLatch(pObj) || 
        (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'r');
      FDATA(pObj)->r_dist = 1;
    } else if (Abc_ObjIsPi(pObj) || 
               (!pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'e');
      FDATA(pObj)->e_dist = 1;
    }

  // until queue is empty...
  while(qpos < Vec_PtrSize(qn)) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(qn, qpos);
    assert(pObj);
    end = Vec_IntEntry(qe, qpos);
    qpos++;
    
    if (end == 'r') {
      d = FDATA(pObj)->r_dist;

      // 1. structural edges
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }
      } else
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }

      if (d == 1) continue;

      // 2. reverse edges (forward retiming only)
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->r_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->r_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'r');
          }          

      // 3. timimg edges (forward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->r_dist) {
              FDATA(pNext)->r_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'r');
            }
          }
#endif
      }
      
    } else { // if 'e'
      if (Abc_ObjIsLatch(pObj)) continue;

      d = FDATA(pObj)->e_dist;

      // 1. through node
      if (!FDATA(pObj)->r_dist) {
        FDATA(pObj)->r_dist = d+1;
        Vec_PtrPush(qn, pObj);
        Vec_IntPush(qe, 'r');
      }

      // 2. reverse edges (backward retiming only)
      if (!pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }  

      // 3. timimg edges (backward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->e_dist) {
              FDATA(pNext)->e_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'e');
            }
          }
#endif
      }
    }
  }
 
  // free time edges
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      vTimeIn = FDATA(pObj)->vNodes;
      if (vTimeIn) {
        Vec_PtrFree(vTimeIn);
        FDATA(pObj)->vNodes = 0;
      }
    }
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i ) {
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->r_dist, 1);
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->e_dist, 1);

#ifdef DEBUG_PREORDER
    printf("node %d\t: r=%d\te=%d\n", Abc_ObjId(pObj), FDATA(pObj)->r_dist, FDATA(pObj)->e_dist);
#endif
  }

  // printf("\t\tpre-ordered (max depth=%d)\n", d+1);

  // deallocate
  Vec_PtrFree( qn );
  Vec_IntFree( qe );
}